

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsRectVisible(ImVec2 *size)

{
  bool bVar1;
  ImRect *this;
  ImGuiWindowTempData *lhs;
  ImVec2 local_30;
  ImRect local_28;
  ImGuiWindow *local_18;
  ImGuiWindow *window;
  ImVec2 *size_local;
  
  local_18 = GImGui->CurrentWindow;
  this = &local_18->ClipRect;
  lhs = &local_18->DC;
  window = (ImGuiWindow *)size;
  local_30 = operator+(&lhs->CursorPos,size);
  ImRect::ImRect(&local_28,&lhs->CursorPos,&local_30);
  bVar1 = ImRect::Overlaps(this,&local_28);
  return bVar1;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}